

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O0

int xmlModuleSymbol(xmlModulePtr module,char *name,void **symbol)

{
  int rc;
  void **symbol_local;
  char *name_local;
  xmlModulePtr module_local;
  
  if (((module == (xmlModulePtr)0x0) || (symbol == (void **)0x0)) || (name == (char *)0x0)) {
    module_local._4_4_ = -1;
  }
  else {
    module_local._4_4_ = xmlModulePlatformSymbol(module->handle,name,symbol);
  }
  return module_local._4_4_;
}

Assistant:

int
xmlModuleSymbol(xmlModulePtr module, const char *name, void **symbol)
{
    int rc = -1;

    if ((NULL == module) || (symbol == NULL) || (name == NULL))
        return rc;

    rc = xmlModulePlatformSymbol(module->handle, name, symbol);

    if (rc == -1)
        return rc;

    return rc;
}